

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Classic_Emu.cpp
# Opt level: O3

void __thiscall Classic_Emu::Classic_Emu(Classic_Emu *this)

{
  Music_Emu::Music_Emu(&this->super_Music_Emu);
  (this->super_Music_Emu).super_Gme_File._vptr_Gme_File = (_func_int **)&PTR__Classic_Emu_007125c0;
  this->voice_types = (int *)0x0;
  this->buf = (Multi_Buffer *)0x0;
  this->stereo_buffer = (Multi_Buffer *)0x0;
  return;
}

Assistant:

Classic_Emu::Classic_Emu()
{
	buf           = 0;
	stereo_buffer = 0;
	voice_types   = 0;
	
	// avoid inconsistency in our duplicated constants
	assert( (int) wave_type  == (int) Multi_Buffer::wave_type );
	assert( (int) noise_type == (int) Multi_Buffer::noise_type );
	assert( (int) mixed_type == (int) Multi_Buffer::mixed_type );
}